

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O0

void RigidBodyDynamics::jcalc(Model *model,uint joint_id,VectorNd *q,VectorNd *qdot)

{
  undefined8 uVar1;
  reference pvVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Scalar SVar6;
  reference this;
  reference ppCVar7;
  ostream *poVar8;
  void *this_00;
  RBDLError *this_01;
  SpatialTransform *in_RCX;
  Matrix3_t *in_RDX;
  uint in_ESI;
  long in_RDI;
  double dVar9;
  double dVar10;
  VectorNd *in_stack_00000048;
  uint in_stack_00000054;
  Model *in_stack_00000058;
  ostringstream errormsg;
  CustomJoint *custom_joint;
  SpatialVector_t *joint;
  Scalar qdot2_3;
  Scalar qdot1_3;
  Scalar qdot0_3;
  Scalar q2_3;
  Scalar q1_3;
  Scalar q0_3;
  Scalar qdot2_2;
  Scalar qdot1_2;
  Scalar qdot0_2;
  Scalar c2_2;
  Scalar s2_2;
  Scalar c1_2;
  Scalar s1_2;
  Scalar c0_2;
  Scalar s0_2;
  Scalar q2_2;
  Scalar q1_2;
  Scalar q0_2;
  Scalar qdot2_1;
  Scalar qdot1_1;
  Scalar qdot0_1;
  Scalar c2_1;
  Scalar s2_1;
  Scalar c1_1;
  Scalar s1_1;
  Scalar c0_1;
  Scalar s0_1;
  Scalar q2_1;
  Scalar q1_1;
  Scalar q0_1;
  Scalar qdot2;
  Scalar qdot1;
  Scalar qdot0;
  Scalar c2;
  Scalar s2;
  Scalar c1;
  Scalar s1;
  Scalar c0;
  Scalar s0;
  Scalar q2;
  Scalar q1;
  Scalar q0;
  Vector3d omega;
  Vector3d c;
  Vector3d St;
  Scalar Jqd;
  SpatialTransform *in_stack_fffffffffffff228;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar11;
  SpatialTransform *in_stack_fffffffffffff230;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_>
  *in_stack_fffffffffffff238;
  SpatialTransform *in_stack_fffffffffffff240;
  string *in_stack_fffffffffffff248;
  Scalar *in_stack_fffffffffffff258;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff260;
  VectorNd *in_stack_fffffffffffff268;
  double *in_stack_fffffffffffff270;
  ostringstream *this_02;
  Model *in_stack_fffffffffffff278;
  Vector3_t *in_stack_fffffffffffff280;
  Matrix3_t *pMVar12;
  double *in_stack_fffffffffffff288;
  Matrix3_t *v4;
  double *in_stack_fffffffffffff290;
  Matrix3_t *v3;
  double *in_stack_fffffffffffff298;
  SpatialTransform *v2;
  double *in_stack_fffffffffffff2a0;
  SpatialTransform *v1;
  double *in_stack_fffffffffffff2a8;
  SpatialTransform *v0;
  SpatialVector_t *in_stack_fffffffffffff2b0;
  double *in_stack_fffffffffffff2b8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff2c0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff2c8;
  double *in_stack_fffffffffffff2d0;
  double *in_stack_fffffffffffff2d8;
  double *in_stack_fffffffffffff2e0;
  double *in_stack_fffffffffffff2e8;
  SpatialTransform *in_stack_fffffffffffff2f0;
  SpatialTransform *in_stack_fffffffffffff2f8;
  Scalar *in_stack_fffffffffffff310;
  ostringstream local_ae0 [216];
  VectorNd *in_stack_fffffffffffff5f8;
  uint in_stack_fffffffffffff604;
  Model *in_stack_fffffffffffff608;
  undefined1 local_958 [88];
  double local_900;
  double local_8f8;
  double local_8f0;
  double local_8c8;
  double local_8c0;
  double local_8b8;
  undefined1 local_8b0 [88];
  double local_858;
  double local_850;
  double local_848;
  double local_840;
  double local_838;
  undefined1 local_830 [8];
  double local_828;
  double local_820;
  double local_818;
  double local_810;
  double local_808;
  double local_800;
  Scalar local_7b0;
  double local_7a8;
  double local_7a0;
  double local_798;
  double local_790;
  double local_788;
  double local_780;
  double local_778;
  double local_770;
  undefined1 local_768 [88];
  double local_710;
  double local_708;
  double local_700;
  double local_6f8;
  double local_6f0;
  double local_6e8;
  double local_6e0;
  double local_6d8;
  double local_6d0;
  double local_6c8;
  double local_6c0;
  double local_670;
  double local_668;
  double local_660;
  undefined1 local_658 [56];
  double local_620;
  double local_618;
  double local_610;
  double local_608;
  double local_600;
  Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_5e0;
  double local_5d0;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  undefined1 local_5a8 [8];
  double local_5a0;
  double local_598;
  double local_590;
  double local_588;
  double local_580;
  double local_578;
  Scalar local_528;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  double local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  SpatialTransform local_4e0;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  double local_2b8;
  double local_1b0;
  SpatialTransform *local_28;
  Matrix3_t *local_20;
  uint local_14;
  long local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  pvVar2 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),(ulong)in_ESI);
  if (pvVar2->mJointType == JointTypeRevoluteX) {
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)(local_10 + 0xa0),(ulong)local_14);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
               in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
    Math::Xrotx(in_stack_fffffffffffff310);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(local_10 + 0xd0),(ulong)local_14);
    Math::SpatialTransform::operator=(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)(local_10 + 0xa0),(ulong)local_14);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
    dVar9 = *pdVar3;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (local_10 + 0xe8),(ulong)local_14);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
    *pSVar4 = dVar9;
  }
  else {
    pvVar2 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(local_10 + 0xa0),(ulong)local_14);
    if (pvVar2->mJointType == JointTypeRevoluteY) {
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(local_10 + 0xa0),(ulong)local_14);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                 in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
      Math::Xroty(in_stack_fffffffffffff310);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_10 + 0xd0),(ulong)local_14);
      Math::SpatialTransform::operator=(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(local_10 + 0xa0),(ulong)local_14);
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
      dVar9 = *pdVar3;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_10 + 0xe8),(ulong)local_14);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                          in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
      *pSVar4 = dVar9;
    }
    else {
      pvVar2 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(local_10 + 0xa0),(ulong)local_14);
      if (pvVar2->mJointType == JointTypeRevoluteZ) {
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(local_10 + 0xa0),(ulong)local_14);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
        Math::Xrotz(in_stack_fffffffffffff310);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_10 + 0xd0),(ulong)local_14);
        Math::SpatialTransform::operator=(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(local_10 + 0xa0),(ulong)local_14);
        pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                            in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
        dVar9 = *pdVar3;
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_10 + 0xe8),(ulong)local_14);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                            in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
        *pSVar4 = dVar9;
      }
      else {
        pvVar2 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)(local_10 + 0xa0),(ulong)local_14);
        if (pvVar2->mJointType == JointTypeHelical) {
          jcalc_XJ(in_stack_fffffffffffff608,in_stack_fffffffffffff604,in_stack_fffffffffffff5f8);
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(local_10 + 0xd0),(ulong)local_14);
          Math::SpatialTransform::operator=(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
          jcalc_X_lambda_S(in_stack_00000058,in_stack_00000054,in_stack_00000048);
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(local_10 + 0xa0),(ulong)local_14);
          pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
          local_1b0 = *pdVar3;
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0xb8),(ulong)local_14);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff278,
                     in_stack_fffffffffffff270);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0xe8),(ulong)local_14);
          SpatialVector_t::operator=
                    ((SpatialVector_t *)in_stack_fffffffffffff230,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                      *)in_stack_fffffffffffff228);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0xb8),(ulong)local_14);
          Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
                    ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff240,
                     (Index)in_stack_fffffffffffff238,(Index)in_stack_fffffffffffff230);
          Vector3_t::Vector3_t<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
                    ((Vector3_t *)in_stack_fffffffffffff230,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_> *
                     )in_stack_fffffffffffff228);
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(local_10 + 0xd0),(ulong)local_14);
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(local_10 + 0xa0),(ulong)local_14);
          Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
                    ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff240,
                     (Index)in_stack_fffffffffffff238,(Index)in_stack_fffffffffffff230);
          Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff240,
                     in_stack_fffffffffffff238);
          Vector3_t::
          Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>,0>>
                    ((Vector3_t *)in_stack_fffffffffffff230,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>,_0>_>
                      *)in_stack_fffffffffffff228);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                    (in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
          Vector3_t::operator=
                    ((Vector3_t *)in_stack_fffffffffffff230,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff228)
          ;
          local_2b8 = -local_1b0 * local_1b0;
          Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
                    (in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          local_2f0 = 0;
          local_2f8 = 0;
          local_300 = 0;
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                     in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                     in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
          in_stack_fffffffffffff228 =
               (SpatialTransform *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
          SpatialVector_t::SpatialVector_t
                    (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
                     in_stack_fffffffffffff298,in_stack_fffffffffffff290,in_stack_fffffffffffff288,
                     (double *)in_stack_fffffffffffff2c0);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0x100),(ulong)local_14);
          SpatialVector_t::operator=
                    ((SpatialVector_t *)in_stack_fffffffffffff230,
                     (SpatialVector_t *)in_stack_fffffffffffff228);
        }
        else {
          pvVar2 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)(local_10 + 0xa0),(ulong)local_14);
          if ((pvVar2->mDoFCount == 1) &&
             (pvVar2 = std::
                       vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                     *)(local_10 + 0xa0),(ulong)local_14),
             pvVar2->mJointType != JointTypeCustom)) {
            jcalc_XJ(in_stack_fffffffffffff608,in_stack_fffffffffffff604,in_stack_fffffffffffff5f8);
            std::
            vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          *)(local_10 + 0xd0),(ulong)local_14);
            Math::SpatialTransform::operator=(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (local_10 + 0xb8),(ulong)local_14);
            std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(local_10 + 0xa0),(ulong)local_14);
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                       in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
            Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       in_stack_fffffffffffff278,in_stack_fffffffffffff270);
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (local_10 + 0xe8),(ulong)local_14);
            SpatialVector_t::operator=
                      ((SpatialVector_t *)in_stack_fffffffffffff230,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                        *)in_stack_fffffffffffff228);
          }
          else {
            pvVar2 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)(local_10 + 0xa0),(ulong)local_14);
            if (pvVar2->mJointType == JointTypeSpherical) {
              Model::GetQuaternion
                        (in_stack_fffffffffffff278,(uint)((ulong)in_stack_fffffffffffff270 >> 0x20),
                         in_stack_fffffffffffff268);
              Math::Quaternion::toMatrix((Quaternion *)in_stack_fffffffffffff2c0);
              local_468 = 0;
              local_470 = 0;
              local_478 = 0;
              Vector3_t::Vector3_t
                        (in_stack_fffffffffffff280,(double *)in_stack_fffffffffffff278,
                         in_stack_fffffffffffff270,(double *)in_stack_fffffffffffff268);
              Math::SpatialTransform::SpatialTransform
                        (in_stack_fffffffffffff240,(Matrix3d *)in_stack_fffffffffffff238,
                         (Vector3d *)in_stack_fffffffffffff230);
              std::
              vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                            *)(local_10 + 0xd0),(ulong)local_14);
              Math::SpatialTransform::operator=(in_stack_fffffffffffff230,in_stack_fffffffffffff228)
              ;
              std::
              vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                            *)(local_10 + 0x160),(ulong)local_14);
              pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                  in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228,
                                  0x838848);
              *pSVar5 = 1.0;
              std::
              vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                            *)(local_10 + 0x160),(ulong)local_14);
              pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                  in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228,
                                  0x838881);
              *pSVar5 = 1.0;
              std::
              vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                            *)(local_10 + 0x160),(ulong)local_14);
              pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                  in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228,
                                  0x8388ba);
              *pSVar5 = 1.0;
              std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            *)(local_10 + 0xa0),(ulong)local_14);
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                         in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
              std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            *)(local_10 + 0xa0),(ulong)local_14);
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                         in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
              std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            *)(local_10 + 0xa0),(ulong)local_14);
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                         in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
              Vector3_t::Vector3_t
                        (in_stack_fffffffffffff280,(double *)in_stack_fffffffffffff278,
                         in_stack_fffffffffffff270,(double *)in_stack_fffffffffffff268);
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
              local_4e0.E.super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
                   = 0.0;
              local_4e0.E.super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
                   = 0.0;
              local_4e0.E.super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
                   = 0.0;
              in_stack_fffffffffffff228 = &local_4e0;
              SpatialVector_t::SpatialVector_t
                        (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                         in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                         in_stack_fffffffffffff290,in_stack_fffffffffffff288,
                         (double *)in_stack_fffffffffffff2c0);
              std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                        ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                         (local_10 + 0xe8),(ulong)local_14);
              SpatialVector_t::operator=
                        ((SpatialVector_t *)in_stack_fffffffffffff230,
                         (SpatialVector_t *)in_stack_fffffffffffff228);
            }
            else {
              pvVar2 = std::
                       vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                     *)(local_10 + 0xa0),(ulong)local_14);
              if (pvVar2->mJointType == JointTypeEulerZYX) {
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
                local_4e8 = *pdVar3;
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
                local_4f0 = *pdVar3;
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
                local_4f8 = *pdVar3;
                local_500 = sin(local_4e8);
                local_508 = cos(local_4e8);
                local_510 = sin(local_4f0);
                local_518 = cos(local_4f0);
                local_520 = sin(local_4f8);
                local_528 = cos(local_4f8);
                local_578 = local_508 * local_518;
                local_580 = local_500 * local_518;
                local_588 = -local_510;
                local_590 = local_508 * local_510 * local_520 + -(local_500 * local_528);
                local_598 = local_500 * local_510 * local_520 + local_508 * local_528;
                local_5a0 = local_518 * local_520;
                local_5a8 = (undefined1  [8])
                            (local_508 * local_510 * local_528 + local_500 * local_520);
                local_5b0 = local_500 * local_510 * local_528 + -(local_508 * local_520);
                local_5b8 = local_518 * local_528;
                pMVar11 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_5a0;
                in_stack_fffffffffffff230 = (SpatialTransform *)local_5a8;
                Matrix3_t::Matrix3_t
                          ((Matrix3_t *)in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
                           (double *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                           in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                           in_stack_fffffffffffff2d0,in_stack_fffffffffffff2d8,
                           in_stack_fffffffffffff2e0,in_stack_fffffffffffff2e8);
                std::
                vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                              *)(local_10 + 0xd0),(ulong)local_14);
                Matrix3_t::operator=(&in_stack_fffffffffffff230->E,(Matrix3_t *)pMVar11);
                SVar6 = -local_510;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11,0x838ed8);
                *pSVar5 = SVar6;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11,0x838f13);
                *pSVar5 = 1.0;
                dVar9 = local_518 * local_520;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11,0x838f68);
                SVar6 = local_528;
                *pSVar5 = dVar9;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11,0x838fb4);
                *pSVar5 = SVar6;
                dVar9 = local_518 * local_528;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11,0x83900a);
                *pSVar5 = dVar9;
                SVar6 = -local_520;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11,0x83906f);
                *pSVar5 = SVar6;
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11);
                local_5c0 = *pdVar3;
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11);
                local_5c8 = *pdVar3;
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                              *)(local_10 + 0xa0),(ulong)local_14);
                pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                         operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                    in_stack_fffffffffffff230,(Index)pMVar11);
                local_5d0 = *pdVar3;
                std::
                vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              *)(local_10 + 0x160),(ulong)local_14);
                Vector3_t::Vector3_t
                          (in_stack_fffffffffffff280,(double *)in_stack_fffffffffffff278,
                           in_stack_fffffffffffff270,(double *)in_stack_fffffffffffff268);
                local_5e0 = Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                                      ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                                       in_stack_fffffffffffff230,pMVar11);
                std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                          ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                           (local_10 + 0xe8),(ulong)local_14);
                SpatialVector_t::operator=
                          ((SpatialVector_t *)in_stack_fffffffffffff230,
                           (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                            *)pMVar11);
                std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                          ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                           (local_10 + 0x100),(ulong)local_14);
                local_600 = -local_518 * local_5c0 * local_5c8;
                local_608 = -(local_520 * local_5c8) * local_5d0 +
                            -local_510 * local_520 * local_5c0 * local_5c8 +
                            local_518 * local_528 * local_5c0 * local_5d0;
                local_610 = -(local_528 * local_5c8) * local_5d0 +
                            -local_510 * local_528 * local_5c0 * local_5c8 +
                            -(local_518 * local_520 * local_5c0 * local_5d0);
                local_618 = 0.0;
                local_620 = 0.0;
                local_658._48_8_ = 0.0;
                in_stack_fffffffffffff228 = (SpatialTransform *)(local_658 + 0x30);
                SpatialVector_t::set
                          (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                           in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                           in_stack_fffffffffffff290,in_stack_fffffffffffff288,
                           (double *)in_stack_fffffffffffff2c0);
              }
              else {
                pvVar2 = std::
                         vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                       *)(local_10 + 0xa0),(ulong)local_14);
                if (pvVar2->mJointType == JointTypeEulerXYZ) {
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
                  local_658._40_8_ = *pdVar3;
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
                  local_658._32_8_ = *pdVar3;
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff230,(Index)in_stack_fffffffffffff228);
                  local_658._24_8_ = *pdVar3;
                  local_658._16_8_ = sin((double)local_658._40_8_);
                  local_658._8_8_ = cos((double)local_658._40_8_);
                  local_658._0_8_ = sin((double)local_658._32_8_);
                  local_660 = cos((double)local_658._32_8_);
                  local_668 = sin((double)local_658._24_8_);
                  local_670 = cos((double)local_658._24_8_);
                  local_6c0 = local_670 * local_660;
                  local_6c8 = local_668 * (double)local_658._8_8_ +
                              local_670 * (double)local_658._0_8_ * (double)local_658._16_8_;
                  local_6d0 = local_668 * (double)local_658._16_8_ +
                              -(local_670 * (double)local_658._0_8_ * (double)local_658._8_8_);
                  local_6d8 = -local_668 * local_660;
                  local_6e0 = local_670 * (double)local_658._8_8_ +
                              -(local_668 * (double)local_658._0_8_ * (double)local_658._16_8_);
                  local_6e8 = local_670 * (double)local_658._16_8_ +
                              local_668 * (double)local_658._0_8_ * (double)local_658._8_8_;
                  local_6f0 = -local_660 * (double)local_658._16_8_;
                  local_6f8 = local_660 * (double)local_658._8_8_;
                  pMVar11 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_6e8;
                  in_stack_fffffffffffff230 = (SpatialTransform *)local_658;
                  Matrix3_t::Matrix3_t
                            ((Matrix3_t *)in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
                             (double *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                             in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                             in_stack_fffffffffffff2d0,in_stack_fffffffffffff2d8,
                             in_stack_fffffffffffff2e0,in_stack_fffffffffffff2e8);
                  std::
                  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                *)(local_10 + 0xd0),(ulong)local_14);
                  Matrix3_t::operator=(&in_stack_fffffffffffff230->E,(Matrix3_t *)pMVar11);
                  dVar10 = local_670 * local_660;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11,0x839869);
                  dVar9 = local_668;
                  *pSVar5 = dVar10;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11,0x8398b6);
                  *pSVar5 = dVar9;
                  dVar10 = -local_668 * local_660;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11,0x839923);
                  dVar9 = local_670;
                  *pSVar5 = dVar10;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11,0x83996f);
                  uVar1 = local_658._0_8_;
                  *pSVar5 = dVar9;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11,0x8399bc);
                  *pSVar5 = (Scalar)uVar1;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11,0x8399f6);
                  *pSVar5 = 1.0;
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11);
                  local_700 = *pdVar3;
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11);
                  local_708 = *pdVar3;
                  std::
                  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                *)(local_10 + 0xa0),(ulong)local_14);
                  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                           operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                      in_stack_fffffffffffff230,(Index)pMVar11);
                  local_710 = *pdVar3;
                  std::
                  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                *)(local_10 + 0x160),(ulong)local_14);
                  Vector3_t::Vector3_t
                            (in_stack_fffffffffffff280,(double *)in_stack_fffffffffffff278,
                             in_stack_fffffffffffff270,(double *)in_stack_fffffffffffff268);
                  local_768._72_16_ =
                       (undefined1  [16])
                       Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                                 ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                                  in_stack_fffffffffffff230,pMVar11);
                  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
                  operator[]((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                             (local_10 + 0xe8),(ulong)local_14);
                  SpatialVector_t::operator=
                            ((SpatialVector_t *)in_stack_fffffffffffff230,
                             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                              *)pMVar11);
                  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
                  operator[]((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                             (local_10 + 0x100),(ulong)local_14);
                  local_768._40_8_ =
                       local_670 * local_710 * local_708 +
                       -local_668 * local_660 * local_710 * local_700 +
                       -(local_670 * (double)local_658._0_8_ * local_708 * local_700);
                  local_768._32_8_ =
                       -(local_668 * local_710) * local_708 +
                       -local_670 * local_660 * local_710 * local_700 +
                       local_668 * (double)local_658._0_8_ * local_708 * local_700;
                  local_768._24_8_ = local_660 * local_708 * local_700;
                  local_768._16_8_ = 0.0;
                  local_768._8_8_ = 0.0;
                  local_768._0_8_ = 0.0;
                  in_stack_fffffffffffff228 = (SpatialTransform *)local_768;
                  SpatialVector_t::set
                            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                             in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                             in_stack_fffffffffffff290,in_stack_fffffffffffff288,
                             (double *)in_stack_fffffffffffff2c0);
                }
                else {
                  pvVar2 = std::
                           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                         *)(local_10 + 0xa0),(ulong)local_14);
                  if (pvVar2->mJointType == JointTypeEulerYXZ) {
                    pMVar12 = local_20;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff230,
                                        (Index)in_stack_fffffffffffff228);
                    local_770 = *pdVar3;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff230,
                                        (Index)in_stack_fffffffffffff228);
                    local_778 = *pdVar3;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff230,
                                        (Index)in_stack_fffffffffffff228);
                    local_780 = *pdVar3;
                    local_788 = sin(local_770);
                    local_790 = cos(local_770);
                    local_798 = sin(local_778);
                    local_7a0 = cos(local_778);
                    local_7a8 = sin(local_780);
                    local_7b0 = cos(local_780);
                    local_800 = local_7b0 * local_790 + local_7a8 * local_798 * local_788;
                    local_808 = local_7a8 * local_7a0;
                    local_810 = -local_7b0 * local_788 + local_7a8 * local_798 * local_790;
                    local_818 = -local_7a8 * local_790 + local_7b0 * local_798 * local_788;
                    local_820 = local_7b0 * local_7a0;
                    local_828 = local_7a8 * local_788 + local_7b0 * local_798 * local_790;
                    local_830 = (undefined1  [8])(local_7a0 * local_788);
                    local_838 = -local_798;
                    local_840 = local_7a0 * local_790;
                    pMVar11 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_828;
                    in_stack_fffffffffffff230 = (SpatialTransform *)local_830;
                    Matrix3_t::Matrix3_t
                              (local_20,(double *)pMVar12,(double *)in_stack_fffffffffffff2b0,
                               in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
                               in_stack_fffffffffffff298,in_stack_fffffffffffff2d0,
                               in_stack_fffffffffffff2d8,in_stack_fffffffffffff2e0,
                               in_stack_fffffffffffff2e8);
                    std::
                    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                  *)(local_10 + 0xd0),(ulong)local_14);
                    Matrix3_t::operator=(&in_stack_fffffffffffff230->E,(Matrix3_t *)pMVar11);
                    dVar9 = local_7a8 * local_7a0;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        in_stack_fffffffffffff230,(Index)pMVar11,0x83a1bc);
                    *pSVar5 = dVar9;
                    pMVar12 = local_20;
                    SVar6 = local_7b0;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        in_stack_fffffffffffff230,(Index)pMVar11,0x83a209);
                    *pSVar5 = SVar6;
                    dVar9 = local_7b0 * local_7a0;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        in_stack_fffffffffffff230,(Index)pMVar11,0x83a25f);
                    *pSVar5 = dVar9;
                    SVar6 = -local_7a8;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        in_stack_fffffffffffff230,(Index)pMVar11,0x83a2c2);
                    *pSVar5 = SVar6;
                    in_stack_fffffffffffff2f0 =
                         (SpatialTransform *)((ulong)local_798 ^ 0x8000000000000000);
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        in_stack_fffffffffffff230,(Index)pMVar11,0x83a326);
                    *pSVar5 = (Scalar)in_stack_fffffffffffff2f0;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                                        in_stack_fffffffffffff230,(Index)pMVar11,0x83a360);
                    *pSVar5 = 1.0;
                    in_stack_fffffffffffff2f8 = local_28;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff230,(Index)pMVar11);
                    local_848 = *pdVar3;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff230,(Index)pMVar11);
                    local_850 = *pdVar3;
                    std::
                    vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  *)(local_10 + 0xa0),(ulong)local_14);
                    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_fffffffffffff230,(Index)pMVar11);
                    local_858 = *pdVar3;
                    std::
                    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                  *)(local_10 + 0x160),(ulong)local_14);
                    Vector3_t::Vector3_t
                              (in_stack_fffffffffffff280,(double *)in_stack_fffffffffffff278,
                               in_stack_fffffffffffff270,(double *)in_stack_fffffffffffff268);
                    local_8b0._72_16_ =
                         (undefined1  [16])
                         Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                                   ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                                    in_stack_fffffffffffff230,pMVar11);
                    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
                    operator[]((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                *)(local_10 + 0xe8),(ulong)local_14);
                    SpatialVector_t::operator=
                              ((SpatialVector_t *)in_stack_fffffffffffff230,
                               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                                *)pMVar11);
                    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
                    operator[]((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                *)(local_10 + 0x100),(ulong)local_14);
                    local_8b0._40_8_ =
                         -(local_7a8 * local_858) * local_850 +
                         local_7b0 * local_7a0 * local_858 * local_848 +
                         -(local_7a8 * local_798 * local_850 * local_848);
                    local_8b0._32_8_ =
                         -(local_7b0 * local_858) * local_850 +
                         -local_7a8 * local_7a0 * local_858 * local_848 +
                         -(local_7b0 * local_798 * local_850 * local_848);
                    local_8b0._24_8_ = -local_7a0 * local_850 * local_848;
                    local_8b0._16_8_ = 0.0;
                    local_8b0._8_8_ = 0.0;
                    local_8b0._0_8_ = 0.0;
                    in_stack_fffffffffffff228 = (SpatialTransform *)local_8b0;
                    SpatialVector_t::set
                              (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                               in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                               in_stack_fffffffffffff290,in_stack_fffffffffffff288,(double *)pMVar12
                              );
                  }
                  else {
                    pvVar2 = std::
                             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                           *)(local_10 + 0xa0),(ulong)local_14);
                    if (pvVar2->mJointType == JointTypeTranslationXYZ) {
                      pMVar12 = local_20;
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228);
                      local_8b8 = *pdVar3;
                      v4 = local_20;
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228);
                      local_8c0 = *pdVar3;
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228);
                      local_8c8 = *pdVar3;
                      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
                      std::
                      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                    *)(local_10 + 0xd0),(ulong)local_14);
                      Matrix3_t::operator=
                                (&in_stack_fffffffffffff230->E,
                                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  *)in_stack_fffffffffffff228);
                      Vector3_t::Vector3_t
                                ((Vector3_t *)pMVar12,(double *)in_stack_fffffffffffff278,
                                 in_stack_fffffffffffff270,(double *)in_stack_fffffffffffff268);
                      std::
                      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                                    *)(local_10 + 0xd0),(ulong)local_14);
                      Vector3_t::operator=
                                ((Vector3_t *)in_stack_fffffffffffff230,
                                 (Vector3_t *)in_stack_fffffffffffff228);
                      std::
                      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                    *)(local_10 + 0x160),(ulong)local_14);
                      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                               operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228,0x83a8df);
                      *pSVar5 = 1.0;
                      std::
                      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                    *)(local_10 + 0x160),(ulong)local_14);
                      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                               operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228,0x83a91a);
                      *pSVar5 = 1.0;
                      std::
                      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                    *)(local_10 + 0x160),(ulong)local_14);
                      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::
                               operator()((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228,0x83a955);
                      *pSVar5 = 1.0;
                      v2 = local_28;
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228);
                      local_8f0 = *pdVar3;
                      v1 = local_28;
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228);
                      local_8f8 = *pdVar3;
                      std::
                      vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                    *)(local_10 + 0xa0),(ulong)local_14);
                      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                           *)in_stack_fffffffffffff230,
                                          (Index)in_stack_fffffffffffff228);
                      local_900 = *pdVar3;
                      this = std::
                             vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                           *)(local_10 + 0x160),(ulong)local_14);
                      v3 = local_20;
                      v0 = local_28;
                      Vector3_t::Vector3_t
                                ((Vector3_t *)pMVar12,(double *)in_stack_fffffffffffff278,
                                 in_stack_fffffffffffff270,(double *)in_stack_fffffffffffff268);
                      local_958._72_16_ =
                           (undefined1  [16])
                           Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                                     ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                                      in_stack_fffffffffffff230,
                                      (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                      in_stack_fffffffffffff228);
                      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
                      operator[]((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                  *)(local_10 + 0xe8),(ulong)local_14);
                      SpatialVector_t::operator=
                                ((SpatialVector_t *)in_stack_fffffffffffff230,
                                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                                  *)in_stack_fffffffffffff228);
                      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
                      operator[]((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                  *)(local_10 + 0x100),(ulong)local_14);
                      local_958._40_8_ = 0.0;
                      local_958._32_8_ = 0.0;
                      local_958._24_8_ = 0.0;
                      local_958._16_8_ = 0.0;
                      local_958._8_8_ = 0.0;
                      local_958._0_8_ = 0.0;
                      in_stack_fffffffffffff228 = (SpatialTransform *)local_958;
                      SpatialVector_t::set
                                ((SpatialVector_t *)this,(double *)v0,(double *)v1,(double *)v2,
                                 (double *)v3,(double *)v4,(double *)in_stack_fffffffffffff2c0);
                    }
                    else {
                      pvVar2 = std::
                               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                             *)(local_10 + 0xa0),(ulong)local_14);
                      if (pvVar2->mJointType != JointTypeCustom) {
                        this_02 = local_ae0;
                        std::__cxx11::ostringstream::ostringstream(this_02);
                        poVar8 = std::operator<<((ostream *)this_02,"Error: invalid joint type ");
                        pvVar2 = std::
                                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                               *)(local_10 + 0xa0),(ulong)local_14);
                        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar2->mJointType);
                        poVar8 = std::operator<<(poVar8," at id ");
                        this_00 = (void *)std::ostream::operator<<(poVar8,local_14);
                        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
                        this_01 = (RBDLError *)__cxa_allocate_exception(0x28);
                        std::__cxx11::ostringstream::str();
                        Errors::RBDLError::RBDLError(this_01,in_stack_fffffffffffff248);
                        __cxa_throw(this_01,&Errors::RBDLError::typeinfo,
                                    Errors::RBDLError::~RBDLError);
                      }
                      pvVar2 = std::
                               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                             *)(local_10 + 0xa0),(ulong)local_14);
                      ppCVar7 = std::
                                vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                              *)(local_10 + 0x1d8),(ulong)pvVar2->custom_joint_index
                                            );
                      (**(code **)(*(long *)*ppCVar7 + 0x10))
                                (*ppCVar7,local_10,local_14,local_20,local_28);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(local_10 + 0xd0),(ulong)local_14);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(local_10 + 0x130),(ulong)local_14);
  Math::SpatialTransform::operator*(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(local_10 + 0x2e8),(ulong)local_14);
  Math::SpatialTransform::operator=(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
  return;
}

Assistant:

RBDL_DLLAPI void jcalc (
    Model &model,
    unsigned int joint_id,
    const VectorNd &q,
    const VectorNd &qdot
    ) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mJointType == JointTypeRevoluteX) {
    model.X_J[joint_id] = Xrotx (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][0] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteY) {
    model.X_J[joint_id] = Xroty (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][1] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteZ) {
    model.X_J[joint_id] = Xrotz (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][2] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeHelical) {
    model.X_J[joint_id] = jcalc_XJ (model, joint_id, q);
    jcalc_X_lambda_S(model, joint_id, q);
    Scalar Jqd = qdot[model.mJoints[joint_id].q_index];
    model.v_J[joint_id] = model.S[joint_id] * Jqd;

    Vector3d St = model.S[joint_id].block<3, 1>(0,0);
    Vector3d c = model.X_J[joint_id].E * model.mJoints[joint_id].mJointAxes[0].block<3, 1>(3,0);
    c = St.cross(c);
    c *= -Jqd * Jqd;    
    model.c_J[joint_id] = SpatialVector(0,0,0,c[0],c[1],c[2]);
  } else if (model.mJoints[joint_id].mDoFCount == 1 &&
      model.mJoints[joint_id].mJointType != JointTypeCustom) {
    model.X_J[joint_id] = jcalc_XJ (model, joint_id, q);
    model.v_J[joint_id] = 
      model.S[joint_id] * qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeSpherical) {
    model.X_J[joint_id] = 
      SpatialTransform (model.GetQuaternion (joint_id, q).toMatrix(), 
          Vector3d (0., 0., 0.));

    model.multdof3_S[joint_id](0,0) = 1.;
    model.multdof3_S[joint_id](1,1) = 1.;
    model.multdof3_S[joint_id](2,2) = 1.;

    Vector3d omega (qdot[model.mJoints[joint_id].q_index],
        qdot[model.mJoints[joint_id].q_index+1],
        qdot[model.mJoints[joint_id].q_index+2]);

    model.v_J[joint_id] = SpatialVector (
        omega[0], omega[1], omega[2],
        0., 0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerZYX) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c0 * c1, s0 * c1, -s1,
        c0 * s1 * s2 - s0 * c2, s0 * s1 * s2 + c0 * c2, c1 * s2,
        c0 * s1 * c2 + s0 * s2, s0 * s1 * c2 - c0 * s2, c1 * c2
        );

    model.multdof3_S[joint_id](0,0) = -s1;
    model.multdof3_S[joint_id](0,2) = 1.;

    model.multdof3_S[joint_id](1,0) = c1 * s2;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = c1 * c2;
    model.multdof3_S[joint_id](2,1) = - s2;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        -c1*qdot0*qdot1,
        -s1*s2*qdot0*qdot1 + c1*c2*qdot0*qdot2 - s2*qdot1*qdot2,
        -s1*c2*qdot0*qdot1 - c1*s2*qdot0*qdot2 - c2*qdot1*qdot2,
        0.,0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c2 * c1, s2 * c0 + c2 * s1 * s0, s2 * s0 - c2 * s1 * c0,
        -s2 * c1, c2 * c0 - s2 * s1 * s0, c2 * s0 + s2 * s1 * c0,
        s1, -c1 * s0, c1 * c0
        );

    model.multdof3_S[joint_id](0,0) = c2 * c1;
    model.multdof3_S[joint_id](0,1) = s2;

    model.multdof3_S[joint_id](1,0) = -s2 * c1;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = s1;
    model.multdof3_S[joint_id](2,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        -s2*c1*qdot2*qdot0 - c2*s1*qdot1*qdot0 + c2*qdot2*qdot1,
        -c2*c1*qdot2*qdot0 + s2*s1*qdot1*qdot0 - s2*qdot2*qdot1,
        c1*qdot1*qdot0,
        0., 0., 0.
        );
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerYXZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c2 * c0 + s2 * s1 * s0, s2 * c1, -c2 * s0 + s2 * s1 * c0,
        -s2 * c0 + c2 * s1 * s0, c2 * c1,  s2 * s0 + c2 * s1 * c0,
        c1 * s0,    - s1,                 c1 * c0);

    model.multdof3_S[joint_id](0,0) = s2 * c1;
    model.multdof3_S[joint_id](0,1) = c2;

    model.multdof3_S[joint_id](1,0) = c2 * c1;
    model.multdof3_S[joint_id](1,1) = -s2;

    model.multdof3_S[joint_id](2,0) = -s1;
    model.multdof3_S[joint_id](2,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        c2*c1*qdot2*qdot0 - s2*s1*qdot1*qdot0 - s2*qdot2*qdot1,
        -s2*c1*qdot2*qdot0 - c2*s1*qdot1*qdot0 - c2*qdot2*qdot1,
        -c1*qdot1*qdot0,
        0., 0., 0.
        );
  } else if(model.mJoints[joint_id].mJointType == JointTypeTranslationXYZ){
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    model.X_J[joint_id].E = Matrix3d::Identity();
    model.X_J[joint_id].r = Vector3d (q0, q1, q2);

    model.multdof3_S[joint_id](3,0) = 1.;
    model.multdof3_S[joint_id](4,1) = 1.;
    model.multdof3_S[joint_id](5,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(0., 0., 0., 0., 0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeCustom) {
    const Joint &joint = model.mJoints[joint_id];
    CustomJoint *custom_joint = 
      model.mCustomJoints[joint.custom_joint_index];
    custom_joint->jcalc (model, joint_id, q, qdot);
  } else {
    std::ostringstream errormsg;
    errormsg << "Error: invalid joint type " << model.mJoints[joint_id].mJointType << " at id " << joint_id << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  model.X_lambda[joint_id] = model.X_J[joint_id] * model.X_T[joint_id];
}